

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O0

RunResult __thiscall wabt::interp::Thread::DoTableSet(Thread *this,Instr instr,Ptr *out_trap)

{
  Store *pSVar1;
  u32 uVar2;
  bool bVar3;
  u32 uVar4;
  RefVec *this_00;
  const_reference pvVar5;
  Table *pTVar6;
  string local_90;
  Ptr local_70;
  size_t local_58;
  Enum local_50;
  u32 local_4c;
  Ref RStack_48;
  uint index;
  Ref ref;
  undefined1 local_38 [8];
  Ptr table;
  Ptr *out_trap_local;
  Thread *this_local;
  
  pSVar1 = this->store_;
  table.root_index_ = (Index)out_trap;
  this_00 = Instance::tables(this->inst_);
  pvVar5 = std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::operator[]
                     (this_00,(ulong)instr.field_2.imm_u32);
  ref.index = pvVar5->index;
  RefPtr<wabt::interp::Table>::RefPtr((RefPtr<wabt::interp::Table> *)local_38,pSVar1,ref);
  RStack_48 = Pop<wabt::interp::Ref>(this);
  local_4c = Pop<unsigned_int>(this);
  pTVar6 = RefPtr<wabt::interp::Table>::operator->((RefPtr<wabt::interp::Table> *)local_38);
  local_58 = RStack_48.index;
  local_50 = (Enum)Table::Set(pTVar6,this->store_,local_4c,RStack_48);
  bVar3 = Failed((Result)local_50);
  uVar2 = local_4c;
  if (bVar3) {
    pSVar1 = this->store_;
    pTVar6 = RefPtr<wabt::interp::Table>::operator->((RefPtr<wabt::interp::Table> *)local_38);
    uVar4 = Table::size(pTVar6);
    StringPrintf_abi_cxx11_
              (&local_90,"out of bounds table access: table.set at %u >= max value %u",(ulong)uVar2,
               (ulong)uVar4);
    Trap::New(&local_70,pSVar1,&local_90,&this->frames_);
    RefPtr<wabt::interp::Trap>::operator=((RefPtr<wabt::interp::Trap> *)table.root_index_,&local_70)
    ;
    this_local._4_4_ = Trap;
    RefPtr<wabt::interp::Trap>::~RefPtr(&local_70);
    std::__cxx11::string::~string((string *)&local_90);
  }
  else {
    this_local._4_4_ = Ok;
  }
  RefPtr<wabt::interp::Table>::~RefPtr((RefPtr<wabt::interp::Table> *)local_38);
  return this_local._4_4_;
}

Assistant:

RunResult Thread::DoTableSet(Instr instr, Trap::Ptr* out_trap) {
  Table::Ptr table{store_, inst_->tables()[instr.imm_u32]};
  auto ref = Pop<Ref>();
  auto index = Pop<u32>();
  TRAP_IF(Failed(table->Set(store_, index, ref)),
          StringPrintf(
              "out of bounds table access: table.set at %u >= max value %u",
              index, table->size()));
  return RunResult::Ok;
}